

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image-write.h
# Opt level: O3

int stbi_write_jpg_core(stbi__write_context *s,int width,int height,int comp,void *data,int quality)

{
  float *pfVar1;
  float *pfVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  stbi__write_context *psVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  undefined4 extraout_var;
  float *pfVar24;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  float *pfVar25;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  uint uVar26;
  undefined4 in_register_0000000c;
  long lVar27;
  uchar *puVar28;
  undefined4 in_register_00000014;
  long lVar29;
  float *pfVar30;
  int iVar31;
  int iVar32;
  byte *pbVar33;
  int iVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  int iVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int bitCnt;
  int bitBuf;
  int local_10ec;
  undefined8 local_10e8;
  long local_10e0;
  stbi__write_context *local_10d8;
  undefined8 local_10d0;
  ulong local_10c8;
  int local_10c0;
  int local_10bc;
  uchar UVTable [64];
  uchar YTable [64];
  float fdtbl_Y [64];
  float fdtbl_UV [64];
  float Y [256];
  float U [256];
  float subV [64];
  float subU [64];
  float V [256];
  
  local_10d0 = CONCAT44(in_register_00000014,height);
  lVar27 = CONCAT44(in_register_0000000c,comp);
  iVar39 = 0;
  if (((height != 0) && (iVar39 = 0, width != 0)) && (lVar27 != 0)) {
    uVar22 = 0x5a;
    if ((uint)data != 0) {
      uVar22 = (uint)data;
    }
    uVar21 = 100;
    if ((int)uVar22 < 100) {
      uVar21 = uVar22;
    }
    uVar26 = 1;
    if (1 < (int)uVar21) {
      uVar26 = uVar21;
    }
    local_10e8 = CONCAT44(local_10e8._4_4_,uVar22);
    if ((int)uVar22 < 0x32) {
      uVar21 = 5000 / (uVar26 & 0xffff);
    }
    else {
      uVar21 = uVar26 * -2 + 200;
    }
    puVar28 = "";
    lVar29 = 0;
    do {
      iVar39 = (int)(*(int *)((long)stbi_write_jpg_core::YQT + lVar29) * uVar21 + 0x32) / 100;
      if (0xfe < iVar39) {
        iVar39 = 0xff;
      }
      if (iVar39 < 2) {
        iVar39 = 1;
      }
      bVar3 = *puVar28;
      YTable[bVar3] = (uchar)iVar39;
      iVar39 = (int)(*(int *)((long)stbi_write_jpg_core::UVQT + lVar29) * uVar21 + 0x32) / 100;
      if (0xfe < iVar39) {
        iVar39 = 0xff;
      }
      if (iVar39 < 2) {
        iVar39 = 1;
      }
      UVTable[bVar3] = (uchar)iVar39;
      lVar29 = lVar29 + 4;
      puVar28 = puVar28 + 1;
    } while (lVar29 != 0x100);
    lVar29 = 0;
    local_10e0 = 0;
    do {
      lVar36 = (long)(int)local_10e0;
      local_10e0 = lVar36 + 8;
      fVar41 = stbi_write_jpg_core::aasf[lVar29];
      pbVar33 = "" + lVar36 + 3;
      lVar38 = 0;
      do {
        bVar3 = pbVar33[-3];
        bVar4 = pbVar33[-2];
        bVar5 = pbVar33[-1];
        bVar6 = *pbVar33;
        auVar7[0xc] = YTable[bVar6];
        auVar7._0_12_ = ZEXT812(0);
        auVar8._10_3_ = auVar7._10_3_;
        auVar8._0_10_ = (unkuint10)YTable[bVar5] << 0x40;
        fVar42 = *(float *)((long)stbi_write_jpg_core::aasf + lVar38);
        fVar43 = *(float *)((long)stbi_write_jpg_core::aasf + lVar38 + 4);
        fVar11 = *(float *)((long)stbi_write_jpg_core::aasf + lVar38 + 8);
        fVar12 = *(float *)((long)stbi_write_jpg_core::aasf + lVar38 + 0xc);
        auVar45._0_4_ = (float)YTable[bVar3] * fVar41 * fVar42;
        auVar45._4_4_ = (float)YTable[bVar4] * fVar41 * fVar43;
        auVar45._8_4_ = (float)auVar8._8_4_ * fVar41 * fVar11;
        auVar45._12_4_ = (float)(uint3)(auVar7._10_3_ >> 0x10) * fVar41 * fVar12;
        auVar45 = divps(_DAT_00143420,auVar45);
        *(undefined1 (*) [16])((long)fdtbl_Y + lVar38 + lVar36 * 4) = auVar45;
        auVar9[0xc] = UVTable[bVar6];
        auVar9._0_12_ = ZEXT812(0);
        auVar10._10_3_ = auVar9._10_3_;
        auVar10._0_10_ = (unkuint10)UVTable[bVar5] << 0x40;
        auVar44._0_4_ = (float)UVTable[bVar3] * fVar41 * fVar42;
        auVar44._4_4_ = (float)UVTable[bVar4] * fVar41 * fVar43;
        auVar44._8_4_ = (float)auVar10._8_4_ * fVar41 * fVar11;
        auVar44._12_4_ = (float)(uint3)(auVar9._10_3_ >> 0x10) * fVar41 * fVar12;
        auVar45 = divps(_DAT_00143420,auVar44);
        *(undefined1 (*) [16])((long)fdtbl_UV + lVar38 + lVar36 * 4) = auVar45;
        lVar38 = lVar38 + 0x10;
        pbVar33 = pbVar33 + 4;
      } while (lVar38 != 0x20);
      lVar29 = lVar29 + 1;
    } while (lVar29 != 8);
    Y[0] = 1.0156891e-28;
    Y[1]._0_1_ = 8;
    Y[1]._1_1_ = (undefined1)((uint)height >> 8);
    Y[1]._2_1_ = (undefined1)height;
    Y[1]._3_1_ = (undefined1)((uint)width >> 8);
    Y[2]._0_1_ = (undefined1)width;
    Y[2]._1_2_ = 0x103;
    Y[2]._3_1_ = 0x11;
    if ((int)uVar22 < 0x5b) {
      Y[2]._3_1_ = 0x22;
    }
    Y[3] = 2.663373e-38;
    Y[4] = -1.7155874e+38;
    Y[5] = 1.4877984e-38;
    local_10d8 = s;
    (*s->func)(s->context,stbi_write_jpg_core::head0,0x19);
    (*s->func)(s->context,YTable,0x40);
    U[0]._0_1_ = 1;
    (*s->func)(s->context,U,1);
    (*s->func)(s->context,UVTable,0x40);
    (*s->func)(s->context,Y,0x18);
    (*s->func)(s->context,"",0x10);
    (*s->func)(s->context,"",0xc);
    U[0]._0_1_ = 0x10;
    (*s->func)(s->context,U,1);
    (*s->func)(s->context,"",0x10);
    (*s->func)(s->context,"\x01\x02\x03",0xa2);
    U[0]._0_1_ = 1;
    (*s->func)(s->context,U,1);
    (*s->func)(s->context,"",0x10);
    (*s->func)(s->context,"",0xc);
    U[0]._0_1_ = 0x11;
    (*s->func)(s->context,U,1);
    (*s->func)(s->context,"",0x10);
    (*s->func)(s->context,"",0xa2);
    (*s->func)(s->context,stbi_write_jpg_core::head2,0xe);
    bitBuf = 0;
    bitCnt = 0;
    iVar39 = (int)local_10d0;
    if ((int)local_10e8 < 0x5b) {
      if (0 < iVar39) {
        iVar39 = iVar39 + 0x3fffffff;
        local_10e8 = 0;
        iVar31 = 0x10;
        local_10e0 = 0;
        uVar23 = 0;
        local_10ec = 0;
        local_10c0 = iVar39;
        do {
          if (0 < width) {
            iVar40 = 0;
            local_10bc = iVar31;
            do {
              psVar20 = local_10d8;
              pfVar24 = V;
              pfVar25 = U;
              pfVar30 = Y;
              iVar31 = local_10ec;
              do {
                iVar32 = iVar39;
                if (iVar31 < (int)local_10d0) {
                  iVar32 = iVar31;
                }
                lVar29 = 0;
                do {
                  iVar34 = iVar40 + (int)lVar29;
                  if (width <= iVar34) {
                    iVar34 = width + 0x3fffffff;
                  }
                  lVar36 = (long)((iVar34 + iVar32 * width) * 4);
                  fVar41 = (float)*(byte *)(lVar27 + lVar36);
                  fVar43 = (float)*(byte *)(lVar27 + 1 + lVar36);
                  fVar42 = (float)*(byte *)(lVar27 + 2 + lVar36);
                  pfVar30[lVar29] = fVar42 * 0.114 + fVar41 * 0.299 + fVar43 * 0.587 + -128.0;
                  pfVar25[lVar29] = fVar42 * 0.5 + fVar41 * -0.16874 + fVar43 * -0.33126;
                  pfVar24[lVar29] = fVar42 * -0.08131 + fVar41 * 0.5 + fVar43 * -0.41869;
                  lVar29 = lVar29 + 1;
                } while ((int)lVar29 != 0x10);
                iVar31 = iVar31 + 1;
                pfVar30 = pfVar30 + 0x10;
                pfVar25 = pfVar25 + 0x10;
                pfVar24 = pfVar24 + 0x10;
              } while (iVar31 != local_10bc);
              local_10c8 = uVar23;
              iVar39 = stbiw__jpg_processDU
                                 (local_10d8,&bitBuf,&bitCnt,Y,0x10,fdtbl_Y,(int)local_10e8,
                                  stbi_write_jpg_core::YDC_HT,stbi_write_jpg_core::YAC_HT);
              iVar39 = stbiw__jpg_processDU
                                 (psVar20,&bitBuf,&bitCnt,Y + 8,0x10,fdtbl_Y,iVar39,
                                  stbi_write_jpg_core::YDC_HT,stbi_write_jpg_core::YAC_HT);
              iVar39 = stbiw__jpg_processDU
                                 (psVar20,&bitBuf,&bitCnt,Y + 0x80,0x10,fdtbl_Y,iVar39,
                                  stbi_write_jpg_core::YDC_HT,stbi_write_jpg_core::YAC_HT);
              iVar39 = stbiw__jpg_processDU
                                 (psVar20,&bitBuf,&bitCnt,Y + 0x88,0x10,fdtbl_Y,iVar39,
                                  stbi_write_jpg_core::YDC_HT,stbi_write_jpg_core::YAC_HT);
              psVar20 = local_10d8;
              local_10e8 = CONCAT44(extraout_var,iVar39);
              pfVar24 = U + 0x10;
              pfVar25 = V + 0x10;
              lVar36 = 0;
              lVar29 = 0;
              do {
                lVar38 = (long)(int)lVar29;
                lVar29 = lVar38 + 8;
                lVar37 = 0;
                do {
                  pfVar1 = (float *)((long)pfVar24 + lVar37 * 2 + -0x40);
                  fVar41 = pfVar1[2];
                  fVar42 = pfVar1[3];
                  pfVar30 = (float *)((long)pfVar24 + lVar37 * 2 + -0x30);
                  fVar43 = *pfVar30;
                  fVar11 = pfVar30[1];
                  fVar12 = pfVar30[2];
                  fVar13 = pfVar30[3];
                  pfVar30 = (float *)((long)pfVar24 + lVar37 * 2);
                  fVar14 = pfVar30[2];
                  fVar15 = pfVar30[3];
                  pfVar2 = (float *)((long)pfVar24 + lVar37 * 2 + 0x10);
                  fVar16 = *pfVar2;
                  fVar17 = pfVar2[1];
                  fVar18 = pfVar2[2];
                  fVar19 = pfVar2[3];
                  pfVar2 = (float *)((long)subU + lVar37 + lVar38 * 4);
                  *pfVar2 = (pfVar30[1] + *pfVar30 + pfVar1[1] + *pfVar1) * 0.25;
                  pfVar2[1] = (fVar15 + fVar14 + fVar42 + fVar41) * 0.25;
                  pfVar2[2] = (fVar17 + fVar16 + fVar11 + fVar43) * 0.25;
                  pfVar2[3] = (fVar19 + fVar18 + fVar13 + fVar12) * 0.25;
                  pfVar1 = (float *)((long)pfVar25 + lVar37 * 2 + -0x40);
                  fVar41 = pfVar1[2];
                  fVar42 = pfVar1[3];
                  pfVar30 = (float *)((long)pfVar25 + lVar37 * 2 + -0x30);
                  fVar43 = *pfVar30;
                  fVar11 = pfVar30[1];
                  fVar12 = pfVar30[2];
                  fVar13 = pfVar30[3];
                  pfVar30 = (float *)((long)pfVar25 + lVar37 * 2);
                  fVar14 = pfVar30[2];
                  fVar15 = pfVar30[3];
                  auVar45 = *(undefined1 (*) [16])((long)pfVar25 + lVar37 * 2 + 0x10);
                  pfVar2 = (float *)((long)subV + lVar37 + lVar38 * 4);
                  *pfVar2 = (pfVar30[1] + *pfVar30 + pfVar1[1] + *pfVar1) * 0.25;
                  pfVar2[1] = (fVar15 + fVar14 + fVar42 + fVar41) * 0.25;
                  pfVar2[2] = (auVar45._4_4_ + auVar45._0_4_ + fVar11 + fVar43) * 0.25;
                  pfVar2[3] = (auVar45._12_4_ + auVar45._8_4_ + fVar13 + fVar12) * 0.25;
                  lVar37 = lVar37 + 0x10;
                } while (lVar37 != 0x20);
                lVar36 = lVar36 + 1;
                pfVar25 = pfVar25 + 0x20;
                pfVar24 = pfVar24 + 0x20;
              } while (lVar36 != 8);
              iVar39 = stbiw__jpg_processDU
                                 (local_10d8,&bitBuf,&bitCnt,subU,8,fdtbl_UV,(int)local_10e0,
                                  stbi_write_jpg_core::UVDC_HT,stbi_write_jpg_core::UVAC_HT);
              local_10e0 = CONCAT44(extraout_var_00,iVar39);
              iVar39 = stbiw__jpg_processDU
                                 (psVar20,&bitBuf,&bitCnt,subV,8,fdtbl_UV,(int)local_10c8,
                                  stbi_write_jpg_core::UVDC_HT,stbi_write_jpg_core::UVAC_HT);
              uVar23 = CONCAT44(extraout_var_01,iVar39);
              iVar40 = iVar40 + 0x10;
              iVar39 = local_10c0;
              iVar31 = local_10bc;
            } while (iVar40 < width);
          }
          local_10ec = local_10ec + 0x10;
          iVar31 = iVar31 + 0x10;
        } while (local_10ec < (int)local_10d0);
      }
    }
    else if (0 < iVar39) {
      local_10e0 = 0;
      iVar31 = 8;
      local_10e8 = 0;
      uVar23 = 0;
      local_10ec = 0;
      do {
        if (0 < width) {
          iVar40 = 0;
          do {
            pfVar25 = V;
            pfVar30 = U;
            pfVar24 = Y;
            iVar32 = local_10ec;
            do {
              iVar34 = iVar39 + 0x3fffffff;
              if (iVar32 < (int)local_10d0) {
                iVar34 = iVar32;
              }
              lVar29 = 0;
              do {
                iVar35 = (int)lVar29 + iVar40;
                if (width <= iVar35) {
                  iVar35 = width + 0x3fffffff;
                }
                lVar36 = (long)((iVar35 + iVar34 * width) * 4);
                fVar41 = (float)*(byte *)(lVar27 + lVar36);
                fVar43 = (float)*(byte *)(lVar27 + 1 + lVar36);
                fVar42 = (float)*(byte *)(lVar27 + 2 + lVar36);
                pfVar24[lVar29] = fVar42 * 0.114 + fVar41 * 0.299 + fVar43 * 0.587 + -128.0;
                pfVar30[lVar29] = fVar42 * 0.5 + fVar41 * -0.16874 + fVar43 * -0.33126;
                pfVar25[lVar29] = fVar42 * -0.08131 + fVar41 * 0.5 + fVar43 * -0.41869;
                lVar29 = lVar29 + 1;
              } while ((int)lVar29 != 8);
              iVar32 = iVar32 + 1;
              pfVar24 = pfVar24 + 8;
              pfVar30 = pfVar30 + 8;
              pfVar25 = pfVar25 + 8;
            } while (iVar32 != iVar31);
            local_10c8 = uVar23;
            iVar32 = stbiw__jpg_processDU
                               (local_10d8,&bitBuf,&bitCnt,Y,8,fdtbl_Y,(int)local_10e0,
                                stbi_write_jpg_core::YDC_HT,stbi_write_jpg_core::YAC_HT);
            local_10e0 = CONCAT44(extraout_var_02,iVar32);
            iVar32 = stbiw__jpg_processDU
                               (local_10d8,&bitBuf,&bitCnt,U,8,fdtbl_UV,(int)local_10e8,
                                stbi_write_jpg_core::UVDC_HT,stbi_write_jpg_core::UVAC_HT);
            local_10e8 = CONCAT44(extraout_var_03,iVar32);
            uVar22 = stbiw__jpg_processDU
                               (local_10d8,&bitBuf,&bitCnt,V,8,fdtbl_UV,(int)local_10c8,
                                stbi_write_jpg_core::UVDC_HT,stbi_write_jpg_core::UVAC_HT);
            uVar23 = (ulong)uVar22;
            iVar40 = iVar40 + 8;
          } while (iVar40 < width);
        }
        local_10ec = local_10ec + 8;
        iVar31 = iVar31 + 8;
      } while (local_10ec < (int)local_10d0);
    }
    psVar20 = local_10d8;
    stbiw__jpg_writeBits(local_10d8,&bitBuf,&bitCnt,(unsigned_short *)0x7f);
    Y[0] = (float)CONCAT31(Y[0]._1_3_,0xff);
    iVar39 = 1;
    (*psVar20->func)(psVar20->context,Y,1);
    Y[0] = (float)CONCAT31(Y[0]._1_3_,0xd9);
    (*psVar20->func)(psVar20->context,Y,1);
  }
  return iVar39;
}

Assistant:

static int stbi_write_jpg_core(stbi__write_context *s, int width, int height, int comp, const void* data, int quality) {
   // Constants that don't pollute global namespace
   static const unsigned char std_dc_luminance_nrcodes[] = {0,0,1,5,1,1,1,1,1,1,0,0,0,0,0,0,0};
   static const unsigned char std_dc_luminance_values[] = {0,1,2,3,4,5,6,7,8,9,10,11};
   static const unsigned char std_ac_luminance_nrcodes[] = {0,0,2,1,3,3,2,4,3,5,5,4,4,0,0,1,0x7d};
   static const unsigned char std_ac_luminance_values[] = {
      0x01,0x02,0x03,0x00,0x04,0x11,0x05,0x12,0x21,0x31,0x41,0x06,0x13,0x51,0x61,0x07,0x22,0x71,0x14,0x32,0x81,0x91,0xa1,0x08,
      0x23,0x42,0xb1,0xc1,0x15,0x52,0xd1,0xf0,0x24,0x33,0x62,0x72,0x82,0x09,0x0a,0x16,0x17,0x18,0x19,0x1a,0x25,0x26,0x27,0x28,
      0x29,0x2a,0x34,0x35,0x36,0x37,0x38,0x39,0x3a,0x43,0x44,0x45,0x46,0x47,0x48,0x49,0x4a,0x53,0x54,0x55,0x56,0x57,0x58,0x59,
      0x5a,0x63,0x64,0x65,0x66,0x67,0x68,0x69,0x6a,0x73,0x74,0x75,0x76,0x77,0x78,0x79,0x7a,0x83,0x84,0x85,0x86,0x87,0x88,0x89,
      0x8a,0x92,0x93,0x94,0x95,0x96,0x97,0x98,0x99,0x9a,0xa2,0xa3,0xa4,0xa5,0xa6,0xa7,0xa8,0xa9,0xaa,0xb2,0xb3,0xb4,0xb5,0xb6,
      0xb7,0xb8,0xb9,0xba,0xc2,0xc3,0xc4,0xc5,0xc6,0xc7,0xc8,0xc9,0xca,0xd2,0xd3,0xd4,0xd5,0xd6,0xd7,0xd8,0xd9,0xda,0xe1,0xe2,
      0xe3,0xe4,0xe5,0xe6,0xe7,0xe8,0xe9,0xea,0xf1,0xf2,0xf3,0xf4,0xf5,0xf6,0xf7,0xf8,0xf9,0xfa
   };
   static const unsigned char std_dc_chrominance_nrcodes[] = {0,0,3,1,1,1,1,1,1,1,1,1,0,0,0,0,0};
   static const unsigned char std_dc_chrominance_values[] = {0,1,2,3,4,5,6,7,8,9,10,11};
   static const unsigned char std_ac_chrominance_nrcodes[] = {0,0,2,1,2,4,4,3,4,7,5,4,4,0,1,2,0x77};
   static const unsigned char std_ac_chrominance_values[] = {
      0x00,0x01,0x02,0x03,0x11,0x04,0x05,0x21,0x31,0x06,0x12,0x41,0x51,0x07,0x61,0x71,0x13,0x22,0x32,0x81,0x08,0x14,0x42,0x91,
      0xa1,0xb1,0xc1,0x09,0x23,0x33,0x52,0xf0,0x15,0x62,0x72,0xd1,0x0a,0x16,0x24,0x34,0xe1,0x25,0xf1,0x17,0x18,0x19,0x1a,0x26,
      0x27,0x28,0x29,0x2a,0x35,0x36,0x37,0x38,0x39,0x3a,0x43,0x44,0x45,0x46,0x47,0x48,0x49,0x4a,0x53,0x54,0x55,0x56,0x57,0x58,
      0x59,0x5a,0x63,0x64,0x65,0x66,0x67,0x68,0x69,0x6a,0x73,0x74,0x75,0x76,0x77,0x78,0x79,0x7a,0x82,0x83,0x84,0x85,0x86,0x87,
      0x88,0x89,0x8a,0x92,0x93,0x94,0x95,0x96,0x97,0x98,0x99,0x9a,0xa2,0xa3,0xa4,0xa5,0xa6,0xa7,0xa8,0xa9,0xaa,0xb2,0xb3,0xb4,
      0xb5,0xb6,0xb7,0xb8,0xb9,0xba,0xc2,0xc3,0xc4,0xc5,0xc6,0xc7,0xc8,0xc9,0xca,0xd2,0xd3,0xd4,0xd5,0xd6,0xd7,0xd8,0xd9,0xda,
      0xe2,0xe3,0xe4,0xe5,0xe6,0xe7,0xe8,0xe9,0xea,0xf2,0xf3,0xf4,0xf5,0xf6,0xf7,0xf8,0xf9,0xfa
   };
   // Huffman tables
   static const unsigned short YDC_HT[256][2] = { {0,2},{2,3},{3,3},{4,3},{5,3},{6,3},{14,4},{30,5},{62,6},{126,7},{254,8},{510,9}};
   static const unsigned short UVDC_HT[256][2] = { {0,2},{1,2},{2,2},{6,3},{14,4},{30,5},{62,6},{126,7},{254,8},{510,9},{1022,10},{2046,11}};
   static const unsigned short YAC_HT[256][2] = {
      {10,4},{0,2},{1,2},{4,3},{11,4},{26,5},{120,7},{248,8},{1014,10},{65410,16},{65411,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {12,4},{27,5},{121,7},{502,9},{2038,11},{65412,16},{65413,16},{65414,16},{65415,16},{65416,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {28,5},{249,8},{1015,10},{4084,12},{65417,16},{65418,16},{65419,16},{65420,16},{65421,16},{65422,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {58,6},{503,9},{4085,12},{65423,16},{65424,16},{65425,16},{65426,16},{65427,16},{65428,16},{65429,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {59,6},{1016,10},{65430,16},{65431,16},{65432,16},{65433,16},{65434,16},{65435,16},{65436,16},{65437,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {122,7},{2039,11},{65438,16},{65439,16},{65440,16},{65441,16},{65442,16},{65443,16},{65444,16},{65445,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {123,7},{4086,12},{65446,16},{65447,16},{65448,16},{65449,16},{65450,16},{65451,16},{65452,16},{65453,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {250,8},{4087,12},{65454,16},{65455,16},{65456,16},{65457,16},{65458,16},{65459,16},{65460,16},{65461,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {504,9},{32704,15},{65462,16},{65463,16},{65464,16},{65465,16},{65466,16},{65467,16},{65468,16},{65469,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {505,9},{65470,16},{65471,16},{65472,16},{65473,16},{65474,16},{65475,16},{65476,16},{65477,16},{65478,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {506,9},{65479,16},{65480,16},{65481,16},{65482,16},{65483,16},{65484,16},{65485,16},{65486,16},{65487,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {1017,10},{65488,16},{65489,16},{65490,16},{65491,16},{65492,16},{65493,16},{65494,16},{65495,16},{65496,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {1018,10},{65497,16},{65498,16},{65499,16},{65500,16},{65501,16},{65502,16},{65503,16},{65504,16},{65505,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {2040,11},{65506,16},{65507,16},{65508,16},{65509,16},{65510,16},{65511,16},{65512,16},{65513,16},{65514,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {65515,16},{65516,16},{65517,16},{65518,16},{65519,16},{65520,16},{65521,16},{65522,16},{65523,16},{65524,16},{0,0},{0,0},{0,0},{0,0},{0,0},
      {2041,11},{65525,16},{65526,16},{65527,16},{65528,16},{65529,16},{65530,16},{65531,16},{65532,16},{65533,16},{65534,16},{0,0},{0,0},{0,0},{0,0},{0,0}
   };
   static const unsigned short UVAC_HT[256][2] = {
      {0,2},{1,2},{4,3},{10,4},{24,5},{25,5},{56,6},{120,7},{500,9},{1014,10},{4084,12},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {11,4},{57,6},{246,8},{501,9},{2038,11},{4085,12},{65416,16},{65417,16},{65418,16},{65419,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {26,5},{247,8},{1015,10},{4086,12},{32706,15},{65420,16},{65421,16},{65422,16},{65423,16},{65424,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {27,5},{248,8},{1016,10},{4087,12},{65425,16},{65426,16},{65427,16},{65428,16},{65429,16},{65430,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {58,6},{502,9},{65431,16},{65432,16},{65433,16},{65434,16},{65435,16},{65436,16},{65437,16},{65438,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {59,6},{1017,10},{65439,16},{65440,16},{65441,16},{65442,16},{65443,16},{65444,16},{65445,16},{65446,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {121,7},{2039,11},{65447,16},{65448,16},{65449,16},{65450,16},{65451,16},{65452,16},{65453,16},{65454,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {122,7},{2040,11},{65455,16},{65456,16},{65457,16},{65458,16},{65459,16},{65460,16},{65461,16},{65462,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {249,8},{65463,16},{65464,16},{65465,16},{65466,16},{65467,16},{65468,16},{65469,16},{65470,16},{65471,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {503,9},{65472,16},{65473,16},{65474,16},{65475,16},{65476,16},{65477,16},{65478,16},{65479,16},{65480,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {504,9},{65481,16},{65482,16},{65483,16},{65484,16},{65485,16},{65486,16},{65487,16},{65488,16},{65489,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {505,9},{65490,16},{65491,16},{65492,16},{65493,16},{65494,16},{65495,16},{65496,16},{65497,16},{65498,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {506,9},{65499,16},{65500,16},{65501,16},{65502,16},{65503,16},{65504,16},{65505,16},{65506,16},{65507,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {2041,11},{65508,16},{65509,16},{65510,16},{65511,16},{65512,16},{65513,16},{65514,16},{65515,16},{65516,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {16352,14},{65517,16},{65518,16},{65519,16},{65520,16},{65521,16},{65522,16},{65523,16},{65524,16},{65525,16},{0,0},{0,0},{0,0},{0,0},{0,0},
      {1018,10},{32707,15},{65526,16},{65527,16},{65528,16},{65529,16},{65530,16},{65531,16},{65532,16},{65533,16},{65534,16},{0,0},{0,0},{0,0},{0,0},{0,0}
   };
   static const int YQT[] = {16,11,10,16,24,40,51,61,12,12,14,19,26,58,60,55,14,13,16,24,40,57,69,56,14,17,22,29,51,87,80,62,18,22,
                             37,56,68,109,103,77,24,35,55,64,81,104,113,92,49,64,78,87,103,121,120,101,72,92,95,98,112,100,103,99};
   static const int UVQT[] = {17,18,24,47,99,99,99,99,18,21,26,66,99,99,99,99,24,26,56,99,99,99,99,99,47,66,99,99,99,99,99,99,
                              99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99};
   static const float aasf[] = { 1.0f * 2.828427125f, 1.387039845f * 2.828427125f, 1.306562965f * 2.828427125f, 1.175875602f * 2.828427125f,
                                 1.0f * 2.828427125f, 0.785694958f * 2.828427125f, 0.541196100f * 2.828427125f, 0.275899379f * 2.828427125f };

   int row, col, i, k, subsample;
   float fdtbl_Y[64], fdtbl_UV[64];
   unsigned char YTable[64], UVTable[64];

   if(!data || !width || !height || comp > 4 || comp < 1) {
      return 0;
   }

   quality = quality ? quality : 90;
   subsample = quality <= 90 ? 1 : 0;
   quality = quality < 1 ? 1 : quality > 100 ? 100 : quality;
   quality = quality < 50 ? 5000 / quality : 200 - quality * 2;

   for(i = 0; i < 64; ++i) {
      int uvti, yti = (YQT[i]*quality+50)/100;
      YTable[stbiw__jpg_ZigZag[i]] = (unsigned char) (yti < 1 ? 1 : yti > 255 ? 255 : yti);
      uvti = (UVQT[i]*quality+50)/100;
      UVTable[stbiw__jpg_ZigZag[i]] = (unsigned char) (uvti < 1 ? 1 : uvti > 255 ? 255 : uvti);
   }

   for(row = 0, k = 0; row < 8; ++row) {
      for(col = 0; col < 8; ++col, ++k) {
         fdtbl_Y[k]  = 1 / (YTable [stbiw__jpg_ZigZag[k]] * aasf[row] * aasf[col]);
         fdtbl_UV[k] = 1 / (UVTable[stbiw__jpg_ZigZag[k]] * aasf[row] * aasf[col]);
      }
   }

   // Write Headers
   {
      static const unsigned char head0[] = { 0xFF,0xD8,0xFF,0xE0,0,0x10,'J','F','I','F',0,1,1,0,0,1,0,1,0,0,0xFF,0xDB,0,0x84,0 };
      static const unsigned char head2[] = { 0xFF,0xDA,0,0xC,3,1,0,2,0x11,3,0x11,0,0x3F,0 };
      const unsigned char head1[] = { 0xFF,0xC0,0,0x11,8,(unsigned char)(height>>8),STBIW_UCHAR(height),(unsigned char)(width>>8),STBIW_UCHAR(width),
                                      3,1,(unsigned char)(subsample?0x22:0x11),0,2,0x11,1,3,0x11,1,0xFF,0xC4,0x01,0xA2,0 };
      s->func(s->context, (void*)head0, sizeof(head0));
      s->func(s->context, (void*)YTable, sizeof(YTable));
      stbiw__putc(s, 1);
      s->func(s->context, UVTable, sizeof(UVTable));
      s->func(s->context, (void*)head1, sizeof(head1));
      s->func(s->context, (void*)(std_dc_luminance_nrcodes+1), sizeof(std_dc_luminance_nrcodes)-1);
      s->func(s->context, (void*)std_dc_luminance_values, sizeof(std_dc_luminance_values));
      stbiw__putc(s, 0x10); // HTYACinfo
      s->func(s->context, (void*)(std_ac_luminance_nrcodes+1), sizeof(std_ac_luminance_nrcodes)-1);
      s->func(s->context, (void*)std_ac_luminance_values, sizeof(std_ac_luminance_values));
      stbiw__putc(s, 1); // HTUDCinfo
      s->func(s->context, (void*)(std_dc_chrominance_nrcodes+1), sizeof(std_dc_chrominance_nrcodes)-1);
      s->func(s->context, (void*)std_dc_chrominance_values, sizeof(std_dc_chrominance_values));
      stbiw__putc(s, 0x11); // HTUACinfo
      s->func(s->context, (void*)(std_ac_chrominance_nrcodes+1), sizeof(std_ac_chrominance_nrcodes)-1);
      s->func(s->context, (void*)std_ac_chrominance_values, sizeof(std_ac_chrominance_values));
      s->func(s->context, (void*)head2, sizeof(head2));
   }

   // Encode 8x8 macroblocks
   {
      static const unsigned short fillBits[] = {0x7F, 7};
      int DCY=0, DCU=0, DCV=0;
      int bitBuf=0, bitCnt=0;
      // comp == 2 is grey+alpha (alpha is ignored)
      int ofsG = comp > 2 ? 1 : 0, ofsB = comp > 2 ? 2 : 0;
      const unsigned char *dataR = (const unsigned char *)data;
      const unsigned char *dataG = dataR + ofsG;
      const unsigned char *dataB = dataR + ofsB;
      int x, y, pos;
      if(subsample) {
         for(y = 0; y < height; y += 16) {
            for(x = 0; x < width; x += 16) {
               float Y[256], U[256], V[256];
               for(row = y, pos = 0; row < y+16; ++row) {
                  // row >= height => use last input row
                  int clamped_row = (row < height) ? row : height - 1;
                  int base_p = (stbi__flip_vertically_on_write ? (height-1-clamped_row) : clamped_row)*width*comp;
                  for(col = x; col < x+16; ++col, ++pos) {
                     // if col >= width => use pixel from last input column
                     int p = base_p + ((col < width) ? col : (width-1))*comp;
                     float r = dataR[p], g = dataG[p], b = dataB[p];
                     Y[pos]= +0.29900f*r + 0.58700f*g + 0.11400f*b - 128;
                     U[pos]= -0.16874f*r - 0.33126f*g + 0.50000f*b;
                     V[pos]= +0.50000f*r - 0.41869f*g - 0.08131f*b;
                  }
               }
               DCY = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, Y+0,   16, fdtbl_Y, DCY, YDC_HT, YAC_HT);
               DCY = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, Y+8,   16, fdtbl_Y, DCY, YDC_HT, YAC_HT);
               DCY = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, Y+128, 16, fdtbl_Y, DCY, YDC_HT, YAC_HT);
               DCY = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, Y+136, 16, fdtbl_Y, DCY, YDC_HT, YAC_HT);

               // subsample U,V
               {
                  float subU[64], subV[64];
                  int yy, xx;
                  for(yy = 0, pos = 0; yy < 8; ++yy) {
                     for(xx = 0; xx < 8; ++xx, ++pos) {
                        int j = yy*32+xx*2;
                        subU[pos] = (U[j+0] + U[j+1] + U[j+16] + U[j+17]) * 0.25f;
                        subV[pos] = (V[j+0] + V[j+1] + V[j+16] + V[j+17]) * 0.25f;
                     }
                  }
                  DCU = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, subU, 8, fdtbl_UV, DCU, UVDC_HT, UVAC_HT);
                  DCV = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, subV, 8, fdtbl_UV, DCV, UVDC_HT, UVAC_HT);
               }
            }
         }
      } else {
         for(y = 0; y < height; y += 8) {
            for(x = 0; x < width; x += 8) {
               float Y[64], U[64], V[64];
               for(row = y, pos = 0; row < y+8; ++row) {
                  // row >= height => use last input row
                  int clamped_row = (row < height) ? row : height - 1;
                  int base_p = (stbi__flip_vertically_on_write ? (height-1-clamped_row) : clamped_row)*width*comp;
                  for(col = x; col < x+8; ++col, ++pos) {
                     // if col >= width => use pixel from last input column
                     int p = base_p + ((col < width) ? col : (width-1))*comp;
                     float r = dataR[p], g = dataG[p], b = dataB[p];
                     Y[pos]= +0.29900f*r + 0.58700f*g + 0.11400f*b - 128;
                     U[pos]= -0.16874f*r - 0.33126f*g + 0.50000f*b;
                     V[pos]= +0.50000f*r - 0.41869f*g - 0.08131f*b;
                  }
               }

               DCY = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, Y, 8, fdtbl_Y,  DCY, YDC_HT, YAC_HT);
               DCU = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, U, 8, fdtbl_UV, DCU, UVDC_HT, UVAC_HT);
               DCV = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, V, 8, fdtbl_UV, DCV, UVDC_HT, UVAC_HT);
            }
         }
      }

      // Do the bit alignment of the EOI marker
      stbiw__jpg_writeBits(s, &bitBuf, &bitCnt, fillBits);
   }

   // EOI
   stbiw__putc(s, 0xFF);
   stbiw__putc(s, 0xD9);

   return 1;
}